

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

bool __thiscall CLIntercept::checkRelaxAllocationLimitsSupport(CLIntercept *this,cl_program program)

{
  bool bVar1;
  cl_int cVar2;
  cl_uint numDevices;
  cl_device_id *deviceList;
  cl_uint local_24;
  cl_device_id *local_20;
  
  local_24 = 0;
  local_20 = (cl_device_id *)0x0;
  cVar2 = allocateAndGetProgramDeviceList(this,program,&local_24,&local_20);
  bVar1 = true;
  if (cVar2 == 0) {
    bVar1 = checkRelaxAllocationLimitsSupport(this,local_24,local_20);
  }
  if (local_20 != (cl_device_id *)0x0) {
    operator_delete__(local_20);
  }
  return (bool)(cVar2 == 0 & bVar1);
}

Assistant:

bool CLIntercept::checkRelaxAllocationLimitsSupport(
    cl_program program ) const
{
    cl_int  errorCode = CL_SUCCESS;
    bool    supported = true;

    cl_uint         numDevices = 0;
    cl_device_id*   deviceList = NULL;
    if( errorCode == CL_SUCCESS )
    {
        errorCode = allocateAndGetProgramDeviceList(
            program,
            numDevices,
            deviceList );
    }

    if( errorCode == CL_SUCCESS )
    {
        supported = checkRelaxAllocationLimitsSupport(
            numDevices,
            deviceList );
    }

    delete [] deviceList;

    return ( errorCode == CL_SUCCESS ) && supported;
}